

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int iso9660_options(archive_write *a,char *key,char *value)

{
  iso9660_conflict *_p;
  int iVar1;
  archive_string *as;
  size_t local_68;
  int local_44;
  uint local_40;
  int num;
  uint32_t seg;
  int r;
  char *p;
  iso9660_conflict *iso9660;
  char *value_local;
  char *key_local;
  archive_write *a_local;
  
  p = (char *)a->format_data;
  iso9660 = (iso9660_conflict *)value;
  value_local = key;
  key_local = (char *)a;
  switch(*key) {
  case 'a':
    iVar1 = strcmp(key,"abstract-file");
    if (iVar1 == 0) {
      iVar1 = get_str_opt((archive_write *)key_local,(archive_string *)(p + 0x1a0),0x25,value_local,
                          (char *)iso9660);
      *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfffffffe | (uint)(iVar1 == 0);
      return iVar1;
    }
    iVar1 = strcmp(value_local,"application-id");
    if (iVar1 == 0) {
      iVar1 = get_str_opt((archive_write *)key_local,(archive_string *)(p + 0x170),0x80,value_local,
                          (char *)iso9660);
      *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfffffffd | (uint)(iVar1 == 0) << 1;
      return iVar1;
    }
    iVar1 = strcmp(value_local,"allow-vernum");
    if (iVar1 == 0) {
      *(uint *)(p + 0x10370) =
           *(uint *)(p + 0x10370) & 0xfffffffb | (uint)(iso9660 != (iso9660_conflict *)0x0) << 2;
      return 0;
    }
    break;
  case 'b':
    iVar1 = strcmp(key,"biblio-file");
    if (iVar1 == 0) {
      iVar1 = get_str_opt((archive_write *)key_local,(archive_string *)(p + 0x1b8),0x25,value_local,
                          (char *)iso9660);
      *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfffffff7 | (uint)(iVar1 == 0) << 3;
      return iVar1;
    }
    iVar1 = strcmp(value_local,"boot");
    _p = iso9660;
    if (iVar1 == 0) {
      if (iso9660 == (iso9660_conflict *)0x0) {
        *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xffffffef;
      }
      else {
        *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xffffffef | 0x10;
        p[0x10330] = '\0';
        p[0x10331] = '\0';
        p[0x10332] = '\0';
        p[0x10333] = '\0';
        p[0x10334] = '\0';
        p[0x10335] = '\0';
        p[0x10336] = '\0';
        p[0x10337] = '\0';
        as = (archive_string *)(p + 0x10328);
        if (iso9660 == (iso9660_conflict *)0x0) {
          local_68 = 0;
        }
        else {
          local_68 = strlen((char *)iso9660);
        }
        archive_strncat(as,_p,local_68);
      }
      return 0;
    }
    iVar1 = strcmp(value_local,"boot-catalog");
    if (iVar1 == 0) {
      iVar1 = get_str_opt((archive_write *)key_local,(archive_string *)(p + 0x10308),0x400,
                          value_local,(char *)iso9660);
      *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xffffffdf | (uint)(iVar1 == 0) << 5;
      return iVar1;
    }
    iVar1 = strcmp(value_local,"boot-info-table");
    if (iVar1 == 0) {
      *(uint *)(p + 0x10370) =
           *(uint *)(p + 0x10370) & 0xffffffbf | (uint)(iso9660 != (iso9660_conflict *)0x0) << 6;
      return 0;
    }
    iVar1 = strcmp(value_local,"boot-load-seg");
    if (iVar1 == 0) {
      *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xffffff7f;
      if (iso9660 != (iso9660_conflict *)0x0) {
        local_40 = 0;
        _seg = iso9660;
        if (((char)iso9660->birth_time == '0') &&
           ((*(char *)((long)&iso9660->birth_time + 1) == 'x' ||
            (*(char *)((long)&iso9660->birth_time + 1) == 'X')))) {
          _seg = (iso9660_conflict *)((long)&iso9660->birth_time + 2);
        }
        do {
          if ((char)_seg->birth_time == '\0') {
            *(short *)(p + 0x1036a) = (short)local_40;
            *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xffffff7f | 0x80;
            return 0;
          }
          if (local_40 != 0) {
            local_40 = local_40 << 4;
          }
          if (((char)_seg->birth_time < 'A') || ('F' < (char)_seg->birth_time)) {
            if (((char)_seg->birth_time < 'a') || ('f' < (char)_seg->birth_time)) {
              if (((char)_seg->birth_time < '0') || ('9' < (char)_seg->birth_time)) break;
              iVar1 = (char)_seg->birth_time + -0x30;
            }
            else {
              iVar1 = (char)_seg->birth_time + -0x57;
            }
          }
          else {
            iVar1 = (char)_seg->birth_time + -0x37;
          }
          local_40 = iVar1 + local_40;
          if (0xffff < local_40) {
            archive_set_error((archive *)key_local,-1,
                              "Invalid value(over 0xffff) for option ``%s\'\'",value_local);
            return -0x1e;
          }
          _seg = (iso9660_conflict *)((long)&_seg->birth_time + 1);
        } while( true );
      }
    }
    else {
      iVar1 = strcmp(value_local,"boot-load-size");
      if (iVar1 == 0) {
        local_44 = 0;
        iVar1 = get_num_opt((archive_write *)key_local,&local_44,0xffff,1,value_local,
                            (char *)iso9660);
        *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfffffeff | (uint)(iVar1 == 0) << 8;
        if (iVar1 == 0) {
          *(short *)(p + 0x1036c) = (short)local_44;
          return 0;
        }
        return -0x1e;
      }
      iVar1 = strcmp(value_local,"boot-type");
      if (iVar1 != 0) {
        return -0x14;
      }
      if (iso9660 != (iso9660_conflict *)0x0) {
        iVar1 = strcmp((char *)iso9660,"no-emulation");
        if (iVar1 == 0) {
          *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfffff9ff | 0x200;
        }
        else {
          iVar1 = strcmp((char *)iso9660,"fd");
          if (iVar1 == 0) {
            *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfffff9ff | 0x400;
          }
          else {
            iVar1 = strcmp((char *)iso9660,"hard-disk");
            if (iVar1 != 0) goto LAB_0087baf0;
            *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfffff9ff | 0x600;
          }
        }
        return 0;
      }
    }
LAB_0087baf0:
    archive_set_error((archive *)key_local,-1,"Invalid value for option ``%s\'\'",value_local);
    return -0x19;
  case 'c':
    iVar1 = strcmp(key,"compression-level");
    if (iVar1 == 0) {
      if (((iso9660 != (iso9660_conflict *)0x0) && ('/' < (char)iso9660->birth_time)) &&
         (((char)iso9660->birth_time < ':' && (*(char *)((long)&iso9660->birth_time + 1) == '\0'))))
      {
        *(int *)(p + 0x2c8) = (char)iso9660->birth_time + -0x30;
        *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfffff7ff | 0x800;
        return 0;
      }
      goto LAB_0087baf0;
    }
    iVar1 = strcmp(value_local,"copyright-file");
    if (iVar1 == 0) {
      iVar1 = get_str_opt((archive_write *)key_local,(archive_string *)(p + 0x188),0x25,value_local,
                          (char *)iso9660);
      *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xffffefff | (uint)(iVar1 == 0) << 0xc;
      return iVar1;
    }
    break;
  case 'i':
    iVar1 = strcmp(key,"iso-level");
    if (iVar1 == 0) {
      if ((((iso9660 != (iso9660_conflict *)0x0) &&
           (*(char *)((long)&iso9660->birth_time + 1) == '\0')) && ('0' < (char)iso9660->birth_time)
          ) && ((char)iso9660->birth_time < '5')) {
        *(uint *)(p + 0x10370) =
             *(uint *)(p + 0x10370) & 0xfffe3fff |
             ((int)(char)iso9660->birth_time - 0x30U & 7) << 0xe;
        return 0;
      }
      goto LAB_0087baf0;
    }
    break;
  case 'j':
    iVar1 = strcmp(key,"joliet");
    if (iVar1 == 0) {
      if (iso9660 == (iso9660_conflict *)0x0) {
        *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfff9ffff;
      }
      else {
        iVar1 = strcmp((char *)iso9660,"1");
        if (iVar1 == 0) {
          *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfff9ffff | 0x20000;
        }
        else {
          iVar1 = strcmp((char *)iso9660,"long");
          if (iVar1 != 0) goto LAB_0087baf0;
          *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfff9ffff | 0x40000;
        }
      }
      return 0;
    }
    break;
  case 'l':
    iVar1 = strcmp(key,"limit-depth");
    if (iVar1 == 0) {
      *(uint *)(p + 0x10370) =
           *(uint *)(p + 0x10370) & 0xfff7ffff | (uint)(iso9660 != (iso9660_conflict *)0x0) << 0x13;
      return 0;
    }
    iVar1 = strcmp(value_local,"limit-dirs");
    if (iVar1 == 0) {
      *(uint *)(p + 0x10370) =
           *(uint *)(p + 0x10370) & 0xffefffff | (uint)(iso9660 != (iso9660_conflict *)0x0) << 0x14;
      return 0;
    }
    break;
  case 'p':
    iVar1 = strcmp(key,"pad");
    if (iVar1 == 0) {
      *(uint *)(p + 0x10370) =
           *(uint *)(p + 0x10370) & 0xffdfffff | (uint)(iso9660 != (iso9660_conflict *)0x0) << 0x15;
      return 0;
    }
    iVar1 = strcmp(value_local,"publisher");
    if (iVar1 == 0) {
      iVar1 = get_str_opt((archive_write *)key_local,(archive_string *)(p + 0x140),0x80,value_local,
                          (char *)iso9660);
      *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xffbfffff | (uint)(iVar1 == 0) << 0x16;
      return iVar1;
    }
    break;
  case 'r':
    iVar1 = strcmp(key,"rockridge");
    if ((iVar1 == 0) || (iVar1 = strcmp(value_local,"Rockridge"), iVar1 == 0)) {
      if (iso9660 == (iso9660_conflict *)0x0) {
        *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfe7fffff;
      }
      else {
        iVar1 = strcmp((char *)iso9660,"1");
        if (iVar1 == 0) {
          *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfe7fffff | 0x1000000;
        }
        else {
          iVar1 = strcmp((char *)iso9660,"strict");
          if (iVar1 == 0) {
            *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfe7fffff | 0x800000;
          }
          else {
            iVar1 = strcmp((char *)iso9660,"useful");
            if (iVar1 != 0) goto LAB_0087baf0;
            *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfe7fffff | 0x1000000;
          }
        }
      }
      return 0;
    }
    break;
  case 'v':
    iVar1 = strcmp(key,"volume-id");
    if (iVar1 == 0) {
      iVar1 = get_str_opt((archive_write *)key_local,(archive_string *)(p + 0x128),0x20,value_local,
                          (char *)iso9660);
      *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfdffffff | (uint)(iVar1 == 0) << 0x19;
      return iVar1;
    }
    break;
  case 'z':
    iVar1 = strcmp(key,"zisofs");
    if (iVar1 == 0) {
      if (iso9660 == (iso9660_conflict *)0x0) {
        *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfbffffff;
      }
      else {
        *(uint *)(p + 0x10370) = *(uint *)(p + 0x10370) & 0xfbffffff | 0x4000000;
      }
      return 0;
    }
  }
  return -0x14;
}

Assistant:

static int
iso9660_options(struct archive_write *a, const char *key, const char *value)
{
	struct iso9660 *iso9660 = a->format_data;
	const char *p;
	int r;

	switch (key[0]) {
	case 'a':
		if (strcmp(key, "abstract-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->abstract_file_identifier),
			    ABSTRACT_FILE_SIZE, key, value);
			iso9660->opt.abstract_file = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "application-id") == 0) {
			r = get_str_opt(a,
			    &(iso9660->application_identifier),
			    APPLICATION_IDENTIFIER_SIZE, key, value);
			iso9660->opt.application_id = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "allow-vernum") == 0) {
			iso9660->opt.allow_vernum = value != NULL;
			return (ARCHIVE_OK);
		}
		break;
	case 'b':
		if (strcmp(key, "biblio-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->bibliographic_file_identifier),
			    BIBLIO_FILE_SIZE, key, value);
			iso9660->opt.biblio_file = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "boot") == 0) {
			if (value == NULL)
				iso9660->opt.boot = 0;
			else {
				iso9660->opt.boot = 1;
				archive_strcpy(
				    &(iso9660->el_torito.boot_filename),
				    value);
			}
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-catalog") == 0) {
			r = get_str_opt(a,
			    &(iso9660->el_torito.catalog_filename),
			    1024, key, value);
			iso9660->opt.boot_catalog = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "boot-info-table") == 0) {
			iso9660->opt.boot_info_table = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-load-seg") == 0) {
			uint32_t seg;

			iso9660->opt.boot_load_seg = 0;
			if (value == NULL)
				goto invalid_value;
			seg = 0;
			p = value;
			if (p[0] == '0' && (p[1] == 'x' || p[1] == 'X'))
				p += 2;
			while (*p) {
				if (seg)
					seg <<= 4;
				if (*p >= 'A' && *p <= 'F')
					seg += *p - 'A' + 0x0a;
				else if (*p >= 'a' && *p <= 'f')
					seg += *p - 'a' + 0x0a;
				else if (*p >= '0' && *p <= '9')
					seg += *p - '0';
				else
					goto invalid_value;
				if (seg > 0xffff) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Invalid value(over 0xffff) for "
					    "option ``%s''", key);
					return (ARCHIVE_FATAL);
				}
				p++;
			}
			iso9660->el_torito.boot_load_seg = (uint16_t)seg;
			iso9660->opt.boot_load_seg = 1;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-load-size") == 0) {
			int num = 0;
			r = get_num_opt(a, &num, 0xffff, 1, key, value);
			iso9660->opt.boot_load_size = r == ARCHIVE_OK;
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->el_torito.boot_load_size = (uint16_t)num;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-type") == 0) {
			if (value == NULL)
				goto invalid_value;
			if (strcmp(value, "no-emulation") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_NO_EMU;
			else if (strcmp(value, "fd") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_FD;
			else if (strcmp(value, "hard-disk") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_HARD_DISK;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'c':
		if (strcmp(key, "compression-level") == 0) {
#ifdef HAVE_ZLIB_H
			if (value == NULL ||
			    !(value[0] >= '0' && value[0] <= '9') ||
			    value[1] != '\0')
				goto invalid_value;
                	iso9660->zisofs.compression_level = value[0] - '0';
			iso9660->opt.compression_level = 1;
                	return (ARCHIVE_OK);
#else
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Option ``%s'' "
			    "is not supported on this platform.", key);
			return (ARCHIVE_FATAL);
#endif
		}
		if (strcmp(key, "copyright-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->copyright_file_identifier),
			    COPYRIGHT_FILE_SIZE, key, value);
			iso9660->opt.copyright_file = r == ARCHIVE_OK;
			return (r);
		}
#ifdef DEBUG
		/* Specifies Volume creation date and time;
		 * year(4),month(2),day(2),hour(2),minute(2),second(2).
		 * e.g. "20090929033757"
		 */
		if (strcmp(key, "creation") == 0) {
			struct tm tm;
			char buf[5];

			p = value;
			if (p == NULL || strlen(p) < 14)
				goto invalid_value;
			memset(&tm, 0, sizeof(tm));
			memcpy(buf, p, 4); buf[4] = '\0'; p += 4;
			tm.tm_year = strtol(buf, NULL, 10) - 1900;
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_mon = strtol(buf, NULL, 10) - 1;
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_mday = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_hour = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_min = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0';
			tm.tm_sec = strtol(buf, NULL, 10);
			iso9660->birth_time = mktime(&tm);
			return (ARCHIVE_OK);
		}
#endif
		break;
	case 'i':
		if (strcmp(key, "iso-level") == 0) {
			if (value != NULL && value[1] == '\0' &&
			    (value[0] >= '1' && value[0] <= '4')) {
				iso9660->opt.iso_level = value[0]-'0';
				return (ARCHIVE_OK);
			}
			goto invalid_value;
		}
		break;
	case 'j':
		if (strcmp(key, "joliet") == 0) {
			if (value == NULL)
				iso9660->opt.joliet = OPT_JOLIET_DISABLE;
			else if (strcmp(value, "1") == 0)
				iso9660->opt.joliet = OPT_JOLIET_ENABLE;
			else if (strcmp(value, "long") == 0)
				iso9660->opt.joliet = OPT_JOLIET_LONGNAME;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'l':
		if (strcmp(key, "limit-depth") == 0) {
			iso9660->opt.limit_depth = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "limit-dirs") == 0) {
			iso9660->opt.limit_dirs = value != NULL;
			return (ARCHIVE_OK);
		}
		break;
	case 'p':
		if (strcmp(key, "pad") == 0) {
			iso9660->opt.pad = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "publisher") == 0) {
			r = get_str_opt(a,
			    &(iso9660->publisher_identifier),
			    PUBLISHER_IDENTIFIER_SIZE, key, value);
			iso9660->opt.publisher = r == ARCHIVE_OK;
			return (r);
		}
		break;
	case 'r':
		if (strcmp(key, "rockridge") == 0 ||
		    strcmp(key, "Rockridge") == 0) {
			if (value == NULL)
				iso9660->opt.rr = OPT_RR_DISABLED;
			else if (strcmp(value, "1") == 0)
				iso9660->opt.rr = OPT_RR_USEFUL;
			else if (strcmp(value, "strict") == 0)
				iso9660->opt.rr = OPT_RR_STRICT;
			else if (strcmp(value, "useful") == 0)
				iso9660->opt.rr = OPT_RR_USEFUL;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'v':
		if (strcmp(key, "volume-id") == 0) {
			r = get_str_opt(a, &(iso9660->volume_identifier),
			    VOLUME_IDENTIFIER_SIZE, key, value);
			iso9660->opt.volume_id = r == ARCHIVE_OK;
			return (r);
		}
		break;
	case 'z':
		if (strcmp(key, "zisofs") == 0) {
			if (value == NULL)
				iso9660->opt.zisofs = OPT_ZISOFS_DISABLED;
			else {
#ifdef HAVE_ZLIB_H
				iso9660->opt.zisofs = OPT_ZISOFS_DIRECT;
#else
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "``zisofs'' "
				    "is not supported on this platform.");
				return (ARCHIVE_FATAL);
#endif
			}
			return (ARCHIVE_OK);
		}
		break;
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);

invalid_value:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Invalid value for option ``%s''", key);
	return (ARCHIVE_FAILED);
}